

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitview.c
# Opt level: O0

void cursorPosFun(GLFWwindow *window,double x,double y)

{
  double dVar1;
  double scale;
  int fb_height;
  int fb_width;
  int wnd_height;
  int wnd_width;
  double y_local;
  double x_local;
  GLFWwindow *window_local;
  
  _wnd_height = y;
  y_local = x;
  x_local = (double)window;
  glfwGetWindowSize(window,&fb_width,&fb_height);
  glfwGetFramebufferSize((GLFWwindow *)x_local,(int *)((long)&scale + 4),(int *)&scale);
  dVar1 = y_local * ((double)scale._4_4_ / (double)fb_width);
  _wnd_height = _wnd_height * ((double)scale._4_4_ / (double)fb_width);
  if (active_view == 1) {
    rot_x = (int)(_wnd_height - ypos) + rot_x;
    rot_z = (int)(dVar1 - xpos) + rot_z;
    do_redraw = 1;
  }
  else if (active_view == 3) {
    rot_x = (int)(_wnd_height - ypos) + rot_x;
    rot_y = (int)(dVar1 - xpos) + rot_y;
    do_redraw = 1;
  }
  else if (active_view == 4) {
    rot_y = (int)(dVar1 - xpos) + rot_y;
    rot_z = (int)(_wnd_height - ypos) + rot_z;
    do_redraw = 1;
  }
  xpos = dVar1;
  ypos = _wnd_height;
  return;
}

Assistant:

static void cursorPosFun(GLFWwindow* window, double x, double y)
{
    int wnd_width, wnd_height, fb_width, fb_height;
    double scale;

    glfwGetWindowSize(window, &wnd_width, &wnd_height);
    glfwGetFramebufferSize(window, &fb_width, &fb_height);

    scale = (double) fb_width / (double) wnd_width;

    x *= scale;
    y *= scale;

    // Depending on which view was selected, rotate around different axes
    switch (active_view)
    {
        case 1:
            rot_x += (int) (y - ypos);
            rot_z += (int) (x - xpos);
            do_redraw = 1;
            break;
        case 3:
            rot_x += (int) (y - ypos);
            rot_y += (int) (x - xpos);
            do_redraw = 1;
            break;
        case 4:
            rot_y += (int) (x - xpos);
            rot_z += (int) (y - ypos);
            do_redraw = 1;
            break;
        default:
            // Do nothing for perspective view, or if no view is selected
            break;
    }

    // Remember cursor position
    xpos = x;
    ypos = y;
}